

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

bool __thiscall anon_unknown.dwarf_4447fb::Db::consumeIf(Db *this,StringView S)

{
  StringView Str;
  bool bVar1;
  size_t sVar2;
  StringView local_38;
  Db *local_28;
  Db *this_local;
  StringView S_local;
  
  S_local.First = S.Last;
  this_local = (Db *)S.First;
  local_28 = this;
  StringView::StringView(&local_38,this->First,this->Last);
  Str.Last = S_local.First;
  Str.First = (char *)this_local;
  bVar1 = StringView::startsWith(&local_38,Str);
  if (bVar1) {
    sVar2 = StringView::size((StringView *)&this_local);
    this->First = this->First + sVar2;
  }
  return bVar1;
}

Assistant:

bool consumeIf(StringView S) {
    if (StringView(First, Last).startsWith(S)) {
      First += S.size();
      return true;
    }
    return false;
  }